

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O1

vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *
Rotate_BSpline(vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>
               *__return_storage_ptr__,Vector3f *o,
              vector<Vector2f,_std::allocator<Vector2f>_> *controls,Material *m,int K)

{
  vector<Vector2f,_std::allocator<Vector2f>_> *this;
  undefined1 (*pauVar1) [64];
  pointer pVVar2;
  pointer pdVar3;
  pointer pdVar4;
  iterator __position;
  bool bVar5;
  undefined8 uVar6;
  pointer pdVar7;
  pointer pdVar8;
  uint uVar9;
  Rotate_BSpline_Segment *this_00;
  float *pfVar10;
  Vector2f *x_2;
  Vector2f *pVVar11;
  pointer pVVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  Vector2f *x;
  ulong uVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 in_XMM4_Qb;
  initializer_list<Vector2f> __l;
  initializer_list<Vector2f> __l_00;
  vector<double,_std::allocator<double>_> s;
  Rotate_BSpline_Segment *s_p;
  Vector2f g;
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  f;
  vector<Vector2f,_std::allocator<Vector2f>_> local_388;
  double local_368;
  uint local_35c;
  undefined1 local_358 [16];
  pointer local_348;
  double local_338;
  ulong local_330;
  vector<Vector2f,_std::allocator<Vector2f>_> local_328;
  vector<double,_std::allocator<double>_> local_308;
  vector<Rotate_BSpline_Segment*,std::allocator<Rotate_BSpline_Segment*>> *local_2e8;
  ulong local_2e0;
  long local_2d8;
  ulong local_2d0;
  Rotate_BSpline_Segment *local_2c8;
  int local_2c0;
  float local_2bc;
  double local_2b8;
  Vector2f local_2a0;
  Vector2f local_298;
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  local_290;
  undefined1 local_278 [16];
  pointer local_268;
  vector<Vector2f,_std::allocator<Vector2f>_> local_258;
  vector<Vector2f,_std::allocator<Vector2f>_> local_238;
  vector<Vector2f,_std::allocator<Vector2f>_> local_218;
  ulong local_1f8;
  vector<Vector2f,_std::allocator<Vector2f>_> *local_1f0;
  ulong local_1e8;
  Vector3f *local_1e0;
  Material *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  vector<Vector2f,_std::allocator<Vector2f>_> local_1b8;
  vector<Vector2f,_std::allocator<Vector2f>_> local_198;
  vector<Vector2f,_std::allocator<Vector2f>_> local_178;
  vector<Vector2f,_std::allocator<Vector2f>_> local_158;
  vector<Vector2f,_std::allocator<Vector2f>_> local_140;
  vector<Vector2f,_std::allocator<Vector2f>_> local_128;
  vector<Vector2f,_std::allocator<Vector2f>_> local_110;
  vector<Vector2f,_std::allocator<Vector2f>_> local_f8;
  vector<Vector2f,_std::allocator<Vector2f>_> local_e0;
  undefined1 local_c8 [16];
  vector<Vector2f,_std::allocator<Vector2f>_> local_b8;
  vector<Vector2f,_std::allocator<Vector2f>_> local_a0;
  vector<Vector2f,_std::allocator<Vector2f>_> local_88;
  vector<Vector2f,_std::allocator<Vector2f>_> local_70;
  vector<Vector2f,_std::allocator<Vector2f>_> local_58;
  Vector2f local_40;
  Vector2f local_38;
  
  uVar14 = (ulong)(uint)K;
  uVar16 = (ulong)((long)(controls->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)(controls->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar9 = (uint)uVar16;
  local_330 = (ulong)(uVar9 + K);
  local_1f0 = controls;
  local_1e0 = o;
  local_1d8 = m;
  std::
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  ::vector(&local_290,(long)(int)(uVar9 + K),(allocator_type *)&local_328);
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8 = (vector<Rotate_BSpline_Segment*,std::allocator<Rotate_BSpline_Segment*>> *)
              __return_storage_ptr__;
  local_2e0 = uVar16;
  local_1f8 = uVar14;
  if (K < (int)uVar9) {
    local_c8._0_8_ = (double)(int)local_330;
    local_2c0 = (uVar9 - 1) + K;
    local_1d0 = (ulong)(K + 1);
    local_c8._8_8_ = local_c8._0_8_;
    local_1e8 = (ulong)(uVar9 & 0x7fffffff);
    local_35c = K;
    local_2b8 = local_c8._0_8_;
    local_1c8 = uVar14;
    do {
      if (-1 < local_2c0) {
        uVar16 = (ulong)local_35c;
        lVar17 = 0;
        uVar14 = 0;
        do {
          this = (vector<Vector2f,_std::allocator<Vector2f>_> *)
                 ((long)&((local_290.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar17);
          pVVar2 = *(pointer *)
                    ((long)&((local_290.
                              super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar17);
          if (*(pointer *)
               ((long)&((local_290.
                         super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                       super__Vector_impl_data._M_finish + lVar17) != pVVar2) {
            (this->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
            super__Vector_impl_data._M_finish = pVVar2;
          }
          if (uVar16 == uVar14) {
            Vector2f::Vector2f((Vector2f *)&local_328,1.0);
            std::vector<Vector2f,_std::allocator<Vector2f>_>::emplace_back<Vector2f>
                      (this,(Vector2f *)&local_328);
          }
          uVar14 = uVar14 + 1;
          lVar17 = lVar17 + 0x18;
        } while (local_330 != uVar14);
      }
      local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (Vector2f *)0x0;
      local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (Vector2f *)0x0;
      local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0 < (int)local_1f8) {
        local_2d8 = -1;
        uVar14 = 1;
        do {
          local_2d0 = uVar14;
          if ((uVar14 == local_1c8) && (uVar9 = (int)local_330 + (int)local_2d8, 0 < (int)uVar9)) {
            local_2bc = (float)(int)uVar14;
            local_1c0 = (ulong)uVar9;
            uVar14 = 0;
            do {
              uVar16 = local_2d0;
              std::vector<Vector2f,_std::allocator<Vector2f>_>::vector(&local_e0,&local_328);
              std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                        (&local_218,
                         local_290.
                         super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14);
              pVVar2 = local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              iVar13 = (int)uVar14 + (int)uVar16;
              if (local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_368 = (double)CONCAT44(local_368._4_4_,
                                             (float)(1.0 / ((double)iVar13 / local_2b8 -
                                                           (double)(int)uVar14 / local_2b8)));
                pVVar12 = local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  Vector2f::operator*=(pVVar12,local_368._0_4_);
                  pVVar12 = pVVar12 + 1;
                } while (pVVar12 != pVVar2);
              }
              local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start = (Vector2f *)0x0;
              local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish = (Vector2f *)0x0;
              local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar14 = uVar14 + 1;
              std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                        (&local_238,
                         local_290.
                         super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14);
              pVVar2 = local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_368 = (double)CONCAT44(local_368._4_4_,
                                             (float)(1.0 / ((double)(iVar13 + 1) / local_2b8 -
                                                           (double)(int)uVar14 / local_2b8)));
                pVVar12 = local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  Vector2f::operator*=(pVVar12,local_368._0_4_);
                  pVVar12 = pVVar12 + 1;
                } while (pVVar12 != pVVar2);
              }
              local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start = (Vector2f *)0x0;
              local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish = (Vector2f *)0x0;
              local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              poly_minus<Vector2f>(&local_70,&local_158,&local_178);
              operator*(&local_38,local_2bc);
              poly_mul<Vector2f>(&local_58,&local_70,&local_38);
              poly_add<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)local_358,&local_e0,
                                 &local_58);
              pVVar2 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_348;
              local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_358._0_8_;
              local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_358._8_8_;
              local_358 = ZEXT816(0) << 0x20;
              local_348 = (pointer)0x0;
              if (pVVar2 != (Vector2f *)0x0) {
                operator_delete(pVVar2);
              }
              if ((pointer)local_358._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_358._0_8_);
              }
              if (local_58.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_58.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_70.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_70.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                operator_delete(local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                operator_delete(local_238.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                operator_delete(local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                operator_delete(local_218.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_e0.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_e0.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            } while (uVar14 < local_1c0);
          }
          uVar9 = (int)local_330 + (int)local_2d8;
          uVar14 = local_2d0;
          if (0 < (int)uVar9) {
            uVar16 = 0;
            do {
              std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                        (&local_110,
                         local_290.
                         super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar16);
              auVar25._0_8_ = (double)(int)uVar16 / local_2b8;
              auVar25._8_8_ = in_XMM4_Qb;
              auVar26._0_4_ = (float)auVar25._0_8_;
              auVar26._4_12_ = auVar25._4_12_;
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar19 = vxorps_avx512vl(auVar26,auVar19);
              local_368 = auVar25._0_8_;
              Vector2f::Vector2f((Vector2f *)&local_388,auVar19._0_4_,auVar19._0_4_);
              Vector2f::Vector2f((Vector2f *)((long)&local_388 + 8),1.0,1.0);
              __l._M_len = 2;
              __l._M_array = (iterator)&local_388;
              std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                        (&local_258,__l,(allocator_type *)&local_338);
              pVVar2 = local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              iVar13 = (int)uVar16 + (int)local_2d0;
              if (local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_368 = (double)CONCAT44(local_368._4_4_,
                                             (float)(1.0 / ((double)iVar13 / local_2b8 - local_368))
                                            );
                pVVar12 = local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  Vector2f::operator*=(pVVar12,local_368._0_4_);
                  pVVar12 = pVVar12 + 1;
                } while (pVVar12 != pVVar2);
              }
              local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start = (Vector2f *)0x0;
              local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish = (Vector2f *)0x0;
              local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              poly_mul<Vector2f>(&local_f8,&local_110,&local_198);
              uVar15 = uVar16 + 1;
              std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                        (&local_128,
                         local_290.
                         super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar15);
              local_368 = (double)(iVar13 + 1) / local_2b8;
              Vector2f::Vector2f(&local_2a0,(float)local_368,(float)local_368);
              Vector2f::Vector2f(&local_298,-1.0,-1.0);
              __l_00._M_len = 2;
              __l_00._M_array = &local_2a0;
              std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                        ((vector<Vector2f,_std::allocator<Vector2f>_> *)local_278,__l_00,
                         (allocator_type *)&local_2c8);
              uVar6 = local_278._8_8_;
              if (local_278._0_8_ != local_278._8_8_) {
                local_368 = (double)CONCAT44(local_368._4_4_,
                                             (float)(1.0 / (local_368 -
                                                           (double)(int)uVar15 / local_2b8)));
                pVVar11 = (Vector2f *)local_278._0_8_;
                do {
                  Vector2f::operator*=(pVVar11,local_368._0_4_);
                  pVVar11 = pVVar11 + 1;
                } while (pVVar11 != (Vector2f *)uVar6);
              }
              local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
              local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
              local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_268;
              local_278 = ZEXT816(0) << 0x20;
              local_268 = (pointer)0x0;
              poly_mul<Vector2f>(&local_88,&local_128,&local_1b8);
              poly_add<Vector2f>((vector<Vector2f,_std::allocator<Vector2f>_> *)local_358,&local_f8,
                                 &local_88);
              pVVar2 = local_290.
                       super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_290.
              super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16].
              super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_358._0_8_;
              local_290.
              super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16].
              super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_358._8_8_;
              local_290.
              super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16].
              super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_348;
              local_358 = ZEXT816(0) << 0x20;
              local_348 = (pointer)0x0;
              if (pVVar2 != (pointer)0x0) {
                operator_delete(pVVar2);
              }
              uVar14 = local_2d0;
              if ((pointer)local_358._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_358._0_8_);
              }
              if (local_88.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if ((pointer)local_278._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_278._0_8_);
              }
              if (local_128.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_128.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_f8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_f8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                operator_delete(local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                operator_delete(local_258.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_110.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_110.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              uVar16 = uVar15;
            } while (uVar15 < uVar9);
          }
          uVar14 = uVar14 + 1;
          local_2d8 = local_2d8 + -1;
        } while (uVar14 != local_1d0);
      }
      local_358 = ZEXT816(0);
      local_348 = (pointer)0x0;
      if (0 < (int)(uint)local_2e0) {
        lVar17 = 0;
        lVar18 = 0;
        uVar14 = local_1e8;
        do {
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    (&local_140,(vector<Vector2f,_std::allocator<Vector2f>_> *)local_358);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    (&local_b8,
                     (vector<Vector2f,_std::allocator<Vector2f>_> *)
                     ((long)&((local_290.
                               super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar18));
          Vector2f::Vector2f(&local_40,
                             (Vector2f *)
                             ((long)((local_1f0->
                                     super__Vector_base<Vector2f,_std::allocator<Vector2f>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->m_elements + lVar17)
                            );
          poly_mul<Vector2f>(&local_a0,&local_b8,&local_40);
          poly_add<Vector2f>(&local_388,&local_140,&local_a0);
          local_348 = local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          uVar6 = local_358._0_8_;
          local_358._0_8_ =
               local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_358._8_8_ =
               local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pointer)uVar6 != (pointer)0x0) {
            operator_delete((void *)uVar6);
          }
          if ((float  [2])
              local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start != (float  [2])0x0) {
            operator_delete(local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a0.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl
                            .super__Vector_impl_data._M_start);
          }
          if (local_b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl
                            .super__Vector_impl_data._M_start);
          }
          if (local_140.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_140.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          lVar18 = lVar18 + 0x18;
          lVar17 = lVar17 + 8;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      this_00 = (Rotate_BSpline_Segment *)operator_new(0xb0);
      Rotate_BSpline_Segment::Rotate_BSpline_Segment(this_00,local_1d8);
      local_2c8 = this_00;
      Vector3f::operator=(&this_00->o,local_1e0);
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0);
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = local_358._8_8_;
      for (pVVar11 = (Vector2f *)local_358._0_8_; pVVar11 != (Vector2f *)uVar6;
          pVVar11 = pVVar11 + 1) {
        Vector2f::Vector2f(&local_2a0,pVVar11);
        pfVar10 = Vector2f::operator[](&local_2a0,0);
        local_338 = (double)*pfVar10;
        if (local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)&local_388,
                     (iterator)
                     local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_338);
        }
        else {
          *local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
           super__Vector_impl_data._M_finish = (Vector2f)local_338;
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      (this_00->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      pdVar3 = (this_00->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (this_00->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pdVar3 != (pointer)0x0) {
        operator_delete(pdVar3);
      }
      if ((float  [2])
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start != (float  [2])0x0) {
        operator_delete(local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0);
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = local_358._8_8_;
      for (pVVar11 = (Vector2f *)local_358._0_8_; pVVar11 != (Vector2f *)uVar6;
          pVVar11 = pVVar11 + 1) {
        Vector2f::Vector2f(&local_2a0,pVVar11);
        pfVar10 = Vector2f::operator[](&local_2a0,1);
        local_338 = (double)*pfVar10;
        if (local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)&local_388,
                     (iterator)
                     local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_338);
        }
        else {
          *local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
           super__Vector_impl_data._M_finish = (Vector2f)local_338;
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      (this_00->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      pdVar3 = (this_00->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (this_00->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pdVar3 != (pointer)0x0) {
        operator_delete(pdVar3);
      }
      if ((float  [2])
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start != (float  [2])0x0) {
        operator_delete(local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pVVar2 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (pVVar12 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar8 = local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
          pdVar7 = local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,
          pdVar3 = local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start, pVVar12 != pVVar2; pVVar12 = pVVar12 + 1) {
        Vector2f::Vector2f((Vector2f *)&local_388,pVVar12);
        pfVar10 = Vector2f::operator[]((Vector2f *)&local_388,1);
        local_2a0.m_elements = (float  [2])(double)*pfVar10;
        if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_308,
                     (iterator)
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_2a0);
        }
        else {
          *local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_2a0.m_elements;
          local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar21 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
      if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar22 = vpbroadcastq_avx512f();
        auVar22 = vpsrlq_avx512f(auVar22,3);
        uVar14 = 0;
        do {
          auVar23 = vpbroadcastq_avx512f();
          auVar23 = vporq_avx512f(auVar23,auVar20);
          uVar16 = vpcmpuq_avx512f(auVar23,auVar22,2);
          pdVar4 = local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar14;
          auVar23._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * (long)pdVar4[1];
          auVar23._0_8_ = (ulong)((byte)uVar16 & 1) * (long)*pdVar4;
          auVar23._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * (long)pdVar4[2];
          auVar23._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * (long)pdVar4[3];
          auVar23._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * (long)pdVar4[4];
          auVar23._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * (long)pdVar4[5];
          auVar23._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * (long)pdVar4[6];
          auVar23._56_8_ = (uVar16 >> 7) * (long)pdVar4[7];
          auVar23 = vxorpd_avx512dq(auVar23,auVar21);
          pauVar1 = (undefined1 (*) [64])
                    (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar14);
          bVar5 = (bool)((byte)uVar16 & 1);
          auVar24._0_8_ = (ulong)bVar5 * auVar23._0_8_ | (ulong)!bVar5 * (long)*(double *)*pauVar1;
          bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar24._8_8_ =
               (ulong)bVar5 * auVar23._8_8_ | (ulong)!bVar5 * (long)*(pointer)((long)*pauVar1 + 8);
          bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar24._16_8_ =
               (ulong)bVar5 * auVar23._16_8_ |
               (ulong)!bVar5 * (long)*(pointer)((long)*pauVar1 + 0x10);
          bVar5 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar24._24_8_ =
               (ulong)bVar5 * auVar23._24_8_ |
               (ulong)!bVar5 * (long)*(pointer)((long)*pauVar1 + 0x18);
          bVar5 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar24._32_8_ =
               (ulong)bVar5 * auVar23._32_8_ |
               (ulong)!bVar5 * (long)*(pointer)((long)*pauVar1 + 0x20);
          bVar5 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar24._40_8_ =
               (ulong)bVar5 * auVar23._40_8_ |
               (ulong)!bVar5 * (long)*(pointer)((long)*pauVar1 + 0x28);
          bVar5 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar24._48_8_ =
               (ulong)bVar5 * auVar23._48_8_ |
               (ulong)!bVar5 * (long)*(pointer)((long)*pauVar1 + 0x30);
          auVar24._56_8_ =
               (uVar16 >> 7) * auVar23._56_8_ |
               (ulong)!SUB81(uVar16 >> 7,0) * (long)*(pointer)((long)*pauVar1 + 0x38);
          *pauVar1 = auVar24;
          uVar14 = uVar14 + 8;
        } while ((((ulong)((long)local_308.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish +
                          (-8 - (long)local_308.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start)) >> 3) + 8 &
                 0xfffffffffffffff8) != uVar14);
      }
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pdVar4 = (this_00->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = pdVar3;
      (this_00->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar7;
      (this_00->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar8;
      if (pdVar4 != (pointer)0x0) {
        operator_delete(pdVar4);
      }
      if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pVVar2 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0);
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pVVar12 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start;
      while( true ) {
        if (pVVar12 == pVVar2) break;
        Vector2f::Vector2f(&local_2a0,pVVar12);
        pfVar10 = Vector2f::operator[](&local_2a0,0);
        local_338 = (double)*pfVar10;
        if (local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)&local_388,
                     (iterator)
                     local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_338);
        }
        else {
          *local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
           super__Vector_impl_data._M_finish = (Vector2f)local_338;
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pVVar12 = pVVar12 + 1;
      }
      (this_00->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      pdVar3 = (this_00->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (this_00->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pdVar3 != (pointer)0x0) {
        operator_delete(pdVar3);
      }
      if ((float  [2])
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start != (float  [2])0x0) {
        operator_delete(local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar9 = local_35c + 1;
      auVar19 = vpinsrd_avx(ZEXT416(local_35c),uVar9,1);
      auVar19 = vcvtdq2pd_avx(auVar19);
      auVar19 = vdivpd_avx(auVar19,local_c8);
      auVar19 = vcvtpd2ps_avx(auVar19);
      auVar19 = vcvtps2pd_avx(auVar19);
      this_00->l = (double)auVar19._0_8_;
      this_00->r = (double)auVar19._8_8_;
      __position._M_current = *(Rotate_BSpline_Segment ***)(local_2e8 + 8);
      local_35c = uVar9;
      if (__position._M_current == *(Rotate_BSpline_Segment ***)(local_2e8 + 0x10)) {
        std::vector<Rotate_BSpline_Segment*,std::allocator<Rotate_BSpline_Segment*>>::
        _M_realloc_insert<Rotate_BSpline_Segment*const&>(local_2e8,__position,&local_2c8);
      }
      else {
        *__position._M_current = local_2c8;
        *(long *)(local_2e8 + 8) = *(long *)(local_2e8 + 8) + 8;
      }
      if ((pointer)local_358._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_358._0_8_);
      }
      if (local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start != (Vector2f *)0x0) {
        operator_delete(local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (local_35c != (uint)local_2e0);
  }
  std::
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  ::~vector(&local_290);
  return (vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *)local_2e8;
}

Assistant:

std::vector<Rotate_BSpline_Segment*> Rotate_BSpline(Vector3f o, std::vector<Vector2f> controls, Material* m, int K=3) {
//	cout << o[0] << ',' << o[1] << "," << o[2] << " | " << controls.size() << "  |  " << m<<" " << K << "?\n";
//	for (auto t : controls) cout << t[0] << "," << t[1] << " "; cout << "?\n";
	using std::vector;
	int N = int(controls.size()) - 1;
	auto tt = [&](int w) {return w * 1.0 / (N + K + 1); };
	vector<vector<Vector2f>> f(N + K + 1);
	std::vector<Rotate_BSpline_Segment*> output;
	for (int g = K; g <= N; ++g) {
		float l = tt(g), r = tt(g + 1);
		for (int j = 0; j < N + K + 1; ++j)
		{
			f[j].clear();
			if (g == j) f[j].push_back(1);
		}
		vector<Vector2f> t;
		for (int x = 1; x <= K; ++x)
		{
			if (x == K)
			{
				for (int j = 0; j < N + K + 1 - x; ++j)
					t = poly_add(t, poly_mul(poly_minus(
						poly_mul(f[j], 1.0 / (tt(j + x) - tt(j))), 
						poly_mul(f[j + 1], 1.0 / (tt(j + x + 1) - tt(j + 1)))), 
						controls[j] * x));
			}
			for (int j = 0; j < N + K + 1 - x; ++j)
				f[j] = poly_add(poly_mul(f[j], poly_mul(
					std::vector<Vector2f>{ Vector2f(-tt(j),-tt(j)),Vector2f(1,1) }, 1.0 / (tt(j + x) - tt(j)))),
				poly_mul(f[j + 1], poly_mul(std::vector<Vector2f>{ 
					Vector2f(tt(j + x + 1), tt(j + x + 1)),Vector2f(-1,-1) }, 1.0 / (tt(j + x + 1) - tt(j + 1)))));
//				f[j] = (g - tt(j)) / (tt(j + x) - tt(j)) * f[j] + (tt(j + x + 1) - g) / (tt(j + x + 1) - tt(j + 1)) * f[j + 1];
		}
		vector<Vector2f> v;
		for (int j = 0; j <= N; ++j)
			v = poly_add(v, poly_mul(f[j], controls[j]));
		auto gx = [](const vector<Vector2f>& t) {
			vector<double> s;
			for (auto g : t)
				s.push_back(g[0]);
			return s;
		};
		auto gy = [](const vector<Vector2f>& t) {
			vector<double> s;
			for (auto g : t)
				s.push_back(g[1]);
			return s;
		};
		Rotate_BSpline_Segment *s_p=new Rotate_BSpline_Segment(m),&s=*s_p;
		s.o = o; s.px = gx(v); s.py = gy(v);
		s.nx = poly_neg(gy(t)); s.ny = gx(t);
		s.l = l; s.r = r; output.push_back(s_p);
	}
//	cerr << K << "," << N << " " << output.size() << "?\n";
	return output;
}